

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
Timing::GetRunningEventDurations
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Timing *this,string *id)

{
  const_iterator cVar1;
  clock_t cVar2;
  ostream *poVar3;
  E *this_00;
  Timing *this_01;
  _Base_ptr p_Var4;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = this;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Timing::Times,_std::allocator<Timing::Times>_>_>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_m_timesMap)._M_t._M_impl.super__Rb_tree_header) {
    for (p_Var4 = *(_Base_ptr *)(cVar1._M_node + 2); p_Var4 != cVar1._M_node[2]._M_parent;
        p_Var4 = (_Base_ptr)&p_Var4->_M_right) {
      if (*(char *)&p_Var4->_M_left == '\0') {
        cVar2 = GetCpuTime(this_01);
        _ss = ClockToSeconds(this_01,cVar2 - *(long *)p_Var4);
        this_01 = (Timing *)__return_storage_ptr__;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&ss);
      }
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a0,"Timing::GetRunningEventDurations No events called \"");
  poVar3 = std::operator<<(poVar3,(string *)id);
  std::operator<<(poVar3,"\" have been stored");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&local_1d0);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

vector<double> Timing::GetRunningEventDurations(const std::string & id) const
{
    vector<double> durations;

    map <string, vector<Times> >::const_iterator it=_m_timesMap.find(id);
    if(it==_m_timesMap.end())
    {
        stringstream ss;
        ss << "Timing::GetRunningEventDurations No events called \""
           << id << "\" have been stored";
        throw(E(ss.str()));
    }
    else
    {
        const vector<Times> &times=it->second;
        for(vector<Times>::const_iterator j=times.begin();
            j!=times.end();++j)
        {
            // here we are only interested in events that are still running
            if(!j->hasEnded)
                durations.push_back(ClockToSeconds(GetCpuTime() - j->start));
        }
    }
    return(durations);
}